

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

void __thiscall r_exec::PTPX::reduce(PTPX *this,View *input)

{
  list<r_exec::Input> *destination;
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  Code *new_cst_00;
  bool bVar3;
  short sVar4;
  int iVar5;
  uint64_t analysis_starting_time;
  Code *object;
  BindingMap *this_00;
  uint64_t uVar6;
  uint64_t uVar7;
  undefined4 extraout_var;
  TimingGuardBuilder *this_01;
  _Fact *f_icst;
  undefined4 extraout_var_00;
  long *plVar8;
  Code *pCVar9;
  undefined4 extraout_var_01;
  list<r_exec::Input> *s;
  P<r_exec::GuardBuilder> in_R8;
  uint64_t in_R9;
  const_iterator local_a0;
  PTPX *local_90;
  uint16_t cause_index;
  P<r_exec::GuardBuilder> guard_builder;
  P<r_exec::BindingMap> end_bm;
  P<r_exec::_Fact> abstract_input;
  Code *new_cst;
  Input cause;
  
  destination = &(this->super__TPX).inputs;
  s = destination;
  AutoFocusController::copy_cross_buffer((this->super__TPX).super_TPX.auto_focus,destination);
  analysis_starting_time = (*Now)();
  object = (Code *)Fact::operator_new((Fact *)0x150,(size_t)s);
  local_90 = this;
  Fact::Fact((Fact *)object,(Fact *)(this->f_imdl).object);
  _Fact::set_opposite((_Fact *)object);
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  end_bm.object = (_Object *)this_00;
  abstract_input.object = &BindingMap::abstract_object(this_00,object,false)->super__Object;
  if ((Code *)abstract_input.object != (Code *)0x0) {
    LOCK();
    paVar1 = &((_Object *)&(abstract_input.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_a0._list = destination;
  local_a0.super__iterator._cell = (local_90->super__TPX).inputs.used_cells_head;
LAB_001a1647:
  do {
    while( true ) {
      if (local_a0.super__iterator._cell._cell == -1) {
        guard_builder.object = (_Object *)0x0;
        local_a0._list = destination;
        for (local_a0.super__iterator._cell = (local_90->super__TPX).inputs.used_cells_head;
            local_a0.super__iterator._cell != -1;
            local_a0.super__iterator._cell =
                 ((local_a0._list)->cells).
                 super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_a0.super__iterator._cell].next) {
          p_Var2 = ((local_a0._list)->cells).
                   super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_a0.super__iterator._cell].data.
                   input.object;
          iVar5 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar5));
          sVar4 = r_code::Atom::asOpcode();
          if (sVar4 != Opcodes::ICst) {
            Input::Input(&cause,&((local_a0._list)->cells).
                                 super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [local_a0.super__iterator._cell].data);
            if (cause.eligible_cause != false) {
              uVar6 = _Fact::get_after((_Fact *)object);
              uVar7 = _Fact::get_after((_Fact *)cause.input.object);
              this_01 = (TimingGuardBuilder *)operator_new(0x18);
              TimingGuardBuilder::TimingGuardBuilder(this_01,uVar6 - uVar7);
              core::P<r_exec::GuardBuilder>::operator=(&guard_builder,(GuardBuilder *)this_01);
              f_icst = _TPX::find_f_icst(&local_90->super__TPX,(_Fact *)cause.input.object,
                                         &cause_index,&new_cst);
              new_cst_00 = new_cst;
              if (f_icst == (_Fact *)0x0) {
                bVar3 = build_mdl(local_90,(_Fact *)cause.input.object,(_Fact *)object,
                                  (GuardBuilder *)guard_builder.object,(uint64_t)in_R8.object);
                if (bVar3) {
                  _TPX::inject_hlps(&local_90->super__TPX,analysis_starting_time);
                }
              }
              else {
                pCVar9 = new_cst;
                if (new_cst == (Code *)0x0) {
                  iVar5 = (*(f_icst->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                            super_LObject.super_Code.super__Object._vptr__Object[9])(f_icst,0);
                  plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x48))
                                             ((long *)CONCAT44(extraout_var_00,iVar5),0);
                  sVar4 = (**(code **)(*plVar8 + 0x50))(plVar8);
                  pCVar9 = (Code *)(**(code **)(*plVar8 + 0x48))(plVar8,sVar4 + -1);
                }
                iVar5 = (*(pCVar9->super__Object)._vptr__Object[9])(pCVar9,(ulong)cause_index);
                in_R8 = guard_builder;
                bVar3 = build_mdl(local_90,f_icst,(_Fact *)CONCAT44(extraout_var_01,iVar5),
                                  (_Fact *)object,(GuardBuilder *)guard_builder.object,in_R9,
                                  new_cst_00);
                if (bVar3) {
                  _TPX::inject_hlps(&local_90->super__TPX,analysis_starting_time);
                }
              }
            }
            Input::~Input(&cause);
          }
        }
        core::P<r_exec::GuardBuilder>::~P(&guard_builder);
        core::P<r_exec::_Fact>::~P(&abstract_input);
        core::P<r_exec::BindingMap>::~P(&end_bm);
        return;
      }
      p_Var2 = ((local_a0._list)->cells).
               super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[local_a0.super__iterator._cell._cell].data.
               input.object;
      (*p_Var2->_vptr__Object[4])(p_Var2,0);
      sVar4 = r_code::Atom::asOpcode();
      if (sVar4 != Opcodes::Cmd) break;
      local_a0 = r_code::list<r_exec::Input>::erase(destination,&local_a0);
    }
    bVar3 = BindingMap::intersect
                      ((BindingMap *)end_bm.object,
                       *(BindingMap **)
                        &((local_a0._list)->cells).
                         super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_a0.super__iterator._cell].
                         data.bindings);
    if (bVar3) {
      uVar6 = _Fact::get_after((_Fact *)((local_a0._list)->cells).
                                        super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [local_a0.super__iterator._cell].data.input.object);
      uVar7 = _Fact::get_after((_Fact *)object);
      if (uVar6 < uVar7) {
        local_a0.super__iterator._cell =
             ((local_a0._list)->cells).
             super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[local_a0.super__iterator._cell].next;
        goto LAB_001a1647;
      }
    }
    local_a0 = r_code::list<r_exec::Input>::erase(destination,&local_a0);
  } while( true );
}

Assistant:

void PTPX::reduce(r_exec::View *input)
{
    auto_focus->copy_cross_buffer(inputs); // the cause of the prediction failure comes before the prediction.
    uint64_t analysis_starting_time = Now();
    _Fact *consequent = new Fact((Fact *)f_imdl); // input->object is the prediction failure: ignore and consider |f->imdl instead.
    consequent->set_opposite();
    P<BindingMap> end_bm = new BindingMap();
    P<_Fact> abstract_input = (_Fact *)end_bm->abstract_object(consequent, false);
    r_code::list<Input>::const_iterator i;

    for (i = inputs.begin(); i != inputs.end();) { // filter out inputs irrelevant for the prediction.
        if (i->input->code(0).asOpcode() == Opcodes::Cmd) { // no cmds as req lhs (because no bwd-operational); prefer: cmd->effect, effect->imdl.
            i = inputs.erase(i);
        } else if (!end_bm->intersect(i->bindings) || // discard inputs that do not share values with the consequent.
                   i->input->get_after() >= consequent->get_after()) { // discard inputs younger than the consequent.
            i = inputs.erase(i);
        } else {
            ++i;
        }
    }

    P<GuardBuilder> guard_builder;
    uint64_t period;

    for (i = inputs.begin(); i != inputs.end(); ++i) {
        if (i->input->get_reference(0)->code(0).asOpcode() == Opcodes::ICst) {
            continue;    // components will be evaluated first, then the icst will be identified.
        }

        Input cause = *i;

        if (!cause.eligible_cause) {
            continue;
        }

        period = consequent->get_after() - cause.input->get_after();
        guard_builder = new TimingGuardBuilder(period); // TODO: use the durations.
        uint16_t cause_index;
        Code *new_cst;
        _Fact *f_icst = find_f_icst(cause.input, cause_index, new_cst);

        if (f_icst == nullptr) {
            if (build_mdl(cause.input, consequent, guard_builder, period)) {
                inject_hlps(analysis_starting_time);
            }
        } else {
            Code *unpacked_cst;

            if (new_cst == nullptr) {
                Code *cst = f_icst->get_reference(0)->get_reference(0);
                unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
            } else {
                unpacked_cst = new_cst;
            }

            _Fact *cause_pattern = (_Fact *)unpacked_cst->get_reference(cause_index);

            if (build_mdl(f_icst, cause_pattern, consequent, guard_builder, period, new_cst)) {
                inject_hlps(analysis_starting_time);
            }
        }
    }
}